

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandLIST(FtpSession *this,string *param)

{
  bool bVar1;
  bool bVar2;
  Permission PVar3;
  FileType FVar4;
  element_type *peVar5;
  ulong uVar6;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [36];
  undefined4 local_29c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  local_298;
  allocator local_261;
  string local_260 [32];
  undefined1 local_240 [8];
  FileStatus dir_status;
  string local_path;
  string local_168 [39];
  byte local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [39];
  byte local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [8];
  string path2dst;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *param_local;
  FtpSession *this_local;
  
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param;
  param_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->logged_in_user_);
  if (!bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Not logged in",&local_39);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    return;
  }
  peVar5 = ::std::__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->logged_in_user_);
  PVar3 = operator&(peVar5->permissions_,DirList);
  if (PVar3 == None) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_70,"Permission denied",&local_71);
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_70);
    ::std::__cxx11::string::~string(local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    return;
  }
  ::std::__cxx11::string::string(local_98);
  bVar1 = ::std::operator==(local_18,"-a");
  if ((((bVar1) || (bVar1 = ::std::operator==(local_18,"-l"), bVar1)) ||
      (bVar1 = ::std::operator==(local_18,"-al"), bVar1)) ||
     (bVar1 = ::std::operator==(local_18,"-la"), bVar1)) {
    ::std::__cxx11::string::operator=(local_98,"");
    goto LAB_0012cc4b;
  }
  local_d9 = 0;
  ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_18);
  bVar1 = ::std::operator==(&local_b8,"-a ");
  if (bVar1) {
LAB_0012c9e7:
    uVar6 = ::std::__cxx11::string::size();
    bVar1 = 3 < uVar6;
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_18);
    local_d9 = 1;
    bVar2 = ::std::operator==(&local_d8,"-l ");
    bVar1 = false;
    if (bVar2) goto LAB_0012c9e7;
  }
  if ((local_d9 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_d8);
  }
  ::std::__cxx11::string::~string((string *)&local_b8);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)local_100,(ulong)local_18);
    ::std::__cxx11::string::operator=(local_98,local_100);
    ::std::__cxx11::string::~string(local_100);
    goto LAB_0012cc4b;
  }
  local_141 = 0;
  ::std::__cxx11::string::substr((ulong)&local_120,(ulong)local_18);
  bVar1 = ::std::operator==(&local_120,"-al ");
  if (bVar1) {
LAB_0012cb5c:
    uVar6 = ::std::__cxx11::string::size();
    bVar1 = 4 < uVar6;
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_140,(ulong)local_18);
    local_141 = 1;
    bVar2 = ::std::operator==(&local_140,"-la ");
    bVar1 = false;
    if (bVar2) goto LAB_0012cb5c;
  }
  if ((local_141 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_140);
  }
  ::std::__cxx11::string::~string((string *)&local_120);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)local_168,(ulong)local_18);
    ::std::__cxx11::string::operator=(local_98,local_168);
    ::std::__cxx11::string::~string(local_168);
  }
  else {
    ::std::__cxx11::string::operator=(local_98,(string *)local_18);
  }
LAB_0012cc4b:
  toLocalPath((FtpSession *)(dir_status.file_status_.__glibc_reserved + 2),(string *)this);
  Filesystem::FileStatus::FileStatus
            ((FileStatus *)local_240,(string *)(dir_status.file_status_.__glibc_reserved + 2));
  bVar1 = Filesystem::FileStatus::isOk((FileStatus *)local_240);
  if (bVar1) {
    FVar4 = Filesystem::FileStatus::type((FileStatus *)local_240);
    if (FVar4 == Dir) {
      bVar1 = Filesystem::FileStatus::canOpenDir((FileStatus *)local_240);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_260,"Sending directory listing",&local_261);
        sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)local_260);
        ::std::__cxx11::string::~string(local_260);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_261);
        Filesystem::dirContent(&local_298,(string *)(dir_status.file_status_.__glibc_reserved + 2));
        sendDirectoryListing
                  (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                         *)&local_298);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                *)&local_298);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_2c0,"Permission denied",&local_2c1);
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_2c0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e8,"Path is not a directory",&local_2e9);
      sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_2e8);
      ::std::__cxx11::string::~string(local_2e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_310,"Path does not exist",&local_311);
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_310);
    ::std::__cxx11::string::~string(local_310);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
  }
  local_29c = 1;
  Filesystem::FileStatus::~FileStatus((FileStatus *)local_240);
  ::std::__cxx11::string::~string((string *)(dir_status.file_status_.__glibc_reserved + 2));
  ::std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

void FtpSession::handleFtpCommandLIST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    // Deal with some unusual commands like "LIST -a", "LIST -a dirname".
    // Some FTP clients send those commands, as if they would call ls on unix.
    // 
    // We try to support those parameters (or rather ignore them), even though
    // this techniqually breaks listing directories that actually use "-a" etc.
    // as directory name. As most clients however first CWD into a directory and
    // call LIST without parameter afterwards and starting a directory name with
    // "-a " / "-l " / "-al " / "-la " is not that common, the compatibility
    // benefit should outperform te potential problems by a lot.
    // 
    // The RFC-violating LIST command now shall be:
    // 
    //   LIST [<SP> <arg>] [<SP> <pathname>] <CRLF>
    // 
    //   with:
    // 
    //     <arg> ::= -a
    //             | -l
    //             | -al
    //             | -la
    //

    std::string path2dst;
    if ((param == "-a") || (param == "-l") || (param == "-al") || (param == "-la"))
    {
      path2dst  = "";
    }
    else if ((param.substr(0, 3)=="-a "|| param.substr(0, 3)=="-l ") && (param.size() > 3))
    {
      path2dst = param.substr(3);
    }
    else if ((param.substr(0, 4) == "-al " || param.substr(0, 4) == "-la ") && (param.size() > 4))
    {
      path2dst = param.substr(4);
    }
    else
    {
      path2dst = param;
    }

    std::string local_path = toLocalPath(path2dst);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending directory listing");
          sendDirectoryListing(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }